

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureState.h
# Opt level: O0

void __thiscall
async_simple::FutureState<async_simple::Unit>::scheduleContinuation
          (FutureState<async_simple::Unit> *this,bool triggerByContinuation)

{
  long *plVar1;
  bool bVar2;
  runtime_error *this_00;
  byte in_SIL;
  atomic<async_simple::detail::State> *in_RDI;
  exception *e;
  ScheduleOptions opts;
  bool ret;
  ContinuationReference guardForException;
  ContinuationReference guard_1;
  ContinuationReference guard;
  FutureState<async_simple::Unit> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  Try<async_simple::Unit> *in_stack_ffffffffffffff38;
  anon_class_8_1_a7ecd3a6 *__f;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  ContinuationReference local_98;
  undefined1 local_90 [39];
  ScheduleOptions local_69;
  ContinuationReference local_68;
  undefined1 local_60 [39];
  byte local_39;
  ContinuationReference local_30 [4];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::atomic<async_simple::detail::State>::load(in_RDI,relaxed);
  logicAssert((bool)in_stack_ffffffffffffff47,(char *)in_stack_ffffffffffffff38);
  if (((in_RDI[0x50]._M_i & ONLY_RESULT) == START) &&
     (((*(long *)(in_RDI + 0x38) == 0 || ((local_9 & 1) != 0)) ||
      (bVar2 = currentThreadInExecutor(in_stack_ffffffffffffff28), bVar2)))) {
    ContinuationReference::ContinuationReference
              ((ContinuationReference *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    util::move_only_function<void_(async_simple::Try<async_simple::Unit>_&&)>::operator()
              ((move_only_function<void_(async_simple::Try<async_simple::Unit>_&&)> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    ContinuationReference::~ContinuationReference((ContinuationReference *)0x34a921);
  }
  else {
    ContinuationReference::ContinuationReference
              ((ContinuationReference *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    ContinuationReference::ContinuationReference
              ((ContinuationReference *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    if (*(long *)(in_RDI + 0x40) == 0) {
      plVar1 = *(long **)(in_RDI + 0x38);
      ContinuationReference::ContinuationReference(&local_68,local_30);
      std::function<void()>::
      function<async_simple::FutureState<async_simple::Unit>::scheduleContinuation(bool)::_lambda()_1_,void>
                ((function<void_()> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 (anon_class_8_1_a7ecd3a6 *)in_stack_ffffffffffffff38);
      local_39 = (**(code **)(*plVar1 + 0x10))(plVar1,local_60);
      local_39 = local_39 & 1;
      std::function<void_()>::~function((function<void_()> *)0x34a9e6);
      scheduleContinuation(bool)::{lambda()#1}::~scheduleContinuation
                ((anon_class_8_1_a7ecd3a6 *)0x34a9f0);
    }
    else {
      ScheduleOptions::ScheduleOptions(&local_69);
      local_69.prompt = (bool)(~in_RDI[0x50]._M_i & 1);
      __f = *(anon_class_8_1_a7ecd3a6 **)(in_RDI + 0x38);
      ContinuationReference::ContinuationReference(&local_98,local_30);
      std::function<void()>::
      function<async_simple::FutureState<async_simple::Unit>::scheduleContinuation(bool)::_lambda()_2_,void>
                ((function<void_()> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 __f);
      local_39 = (*(code *)((__f->fsRef)._fs)->_executor)
                           (__f,local_90,*(undefined8 *)(in_RDI + 0x40),local_69.prompt);
      local_39 = local_39 & 1;
      std::function<void_()>::~function((function<void_()> *)0x34aaf9);
      scheduleContinuation(bool)::{lambda()#2}::~scheduleContinuation
                ((anon_class_8_1_a7ecd3a6 *)0x34ab03);
    }
    if ((local_39 & 1) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"schedule continuation in executor failed");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ContinuationReference::~ContinuationReference((ContinuationReference *)0x34ac01);
    ContinuationReference::~ContinuationReference((ContinuationReference *)0x34ac0e);
  }
  return;
}

Assistant:

void scheduleContinuation(bool triggerByContinuation) {
        logicAssert(
            _state.load(std::memory_order_relaxed) == detail::State::DONE,
            "FutureState is not DONE");
        if (!_forceSched && (!_executor || triggerByContinuation ||
                             currentThreadInExecutor())) {
            // execute inplace for better performance
            ContinuationReference guard(this);
            _continuation(std::move(_try_value));
        } else {
            ContinuationReference guard(this);
            ContinuationReference guardForException(this);
            try {
                bool ret;
                if (Executor::NULLCTX == _context) {
                    ret = _executor->schedule(
                        [fsRef = std::move(guard)]() mutable {
                            auto ref = std::move(fsRef);
                            auto fs = ref.getFutureState();
                            fs->_continuation(std::move(fs->_try_value));
                        });
                } else {
                    ScheduleOptions opts;
                    opts.prompt = !_forceSched;
                    // schedule continuation in the same context before
                    // checkout()
                    ret = _executor->checkin(
                        [fsRef = std::move(guard)]() mutable {
                            auto ref = std::move(fsRef);
                            auto fs = ref.getFutureState();
                            fs->_continuation(std::move(fs->_try_value));
                        },
                        _context, opts);
                }
                if (!ret) {
                    throw std::runtime_error(
                        "schedule continuation in executor failed");
                }
            } catch (std::exception& e) {
                // reschedule failed, execute inplace
                _continuation(std::move(_try_value));
            }
        }
    }